

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

double gmlc::utilities::numeric_conversionComplete<double>(string_view V,double defValue)

{
  utilities *puVar1;
  bool bVar2;
  int iVar3;
  size_t *in_RCX;
  char *in_RDX;
  utilities *this;
  double dVar4;
  string_view V_00;
  string_view input;
  size_t rem;
  utilities *local_28;
  double local_20;
  
  V_00._M_len = V._M_str;
  this = (utilities *)V._M_len;
  V_00._M_str = in_RDX;
  bVar2 = nonNumericFirstOrLastCharacter(this,V_00);
  dVar4 = defValue;
  if (!bVar2) {
    input._M_str = (char *)&local_28;
    input._M_len = (size_t)V_00._M_len;
    local_20 = strViewToFloat<double>(this,input,in_RCX);
    while ((puVar1 = local_28, dVar4 = local_20, local_28 < this &&
           (iVar3 = isspace((int)V_00._M_len[(long)local_28]), dVar4 = defValue, iVar3 != 0))) {
      local_28 = puVar1 + 1;
    }
  }
  return dVar4;
}

Assistant:

X numeric_conversionComplete(std::string_view V, const X defValue)
{
    if (nonNumericFirstOrLastCharacter(V)) {
        return defValue;
    }
    try {
        size_t rem;
        X res = numConvComp<X>(V, rem);
        while (rem < V.length()) {
            if (!(isspace(V[rem]))) {
                res = defValue;
                break;
            }
            ++rem;
        }
        return res;
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}